

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_test.c
# Opt level: O0

bool_t zzTestGCD(void)

{
  u32 seed;
  int iVar1;
  size_t sVar2;
  word *a_00;
  word *d;
  size_t sVar3;
  size_t nb;
  size_t na;
  octet stack [2048];
  octet combo_state [32];
  word p1 [24];
  word p [16];
  word t1 [16];
  word t [8];
  word b [8];
  word a [8];
  size_t reps;
  undefined1 *in_stack_fffffffffffff4a0;
  word *in_stack_fffffffffffff4a8;
  word *in_stack_fffffffffffff4b0;
  void *in_stack_fffffffffffff4b8;
  word *in_stack_fffffffffffff4c0;
  word *in_stack_fffffffffffff4c8;
  word *in_stack_fffffffffffff4d0;
  word *in_stack_fffffffffffff4d8;
  word *in_stack_fffffffffffff4e0;
  word *in_stack_fffffffffffff4e8;
  word *in_stack_fffffffffffff4f0;
  word *in_stack_fffffffffffff4f8;
  word *in_stack_fffffffffffff500;
  void *stack_00;
  word *b_00;
  word *local_ac8;
  word *local_ac0;
  undefined1 local_ab8 [16];
  word *in_stack_fffffffffffff558;
  size_t in_stack_fffffffffffff560;
  word *in_stack_fffffffffffff568;
  word *in_stack_fffffffffffff570;
  word *in_stack_fffffffffffff578;
  word *in_stack_fffffffffffff580;
  size_t in_stack_fffffffffffff590;
  void *in_stack_fffffffffffff598;
  word local_2b8 [4];
  word local_298 [24];
  word local_1d8 [32];
  word local_d8 [8];
  void *local_98;
  size_t local_58;
  long local_10;
  
  local_10 = 100;
  sVar2 = prngCOMBO_keep();
  if (sVar2 < 0x21) {
    sVar2 = zzMul_deep(8,8);
    a_00 = (word *)zzGCD_deep(8,8);
    d = (word *)zzLCM_deep((size_t)in_stack_fffffffffffff4e0,(size_t)in_stack_fffffffffffff4d8);
    sVar3 = zzExGCD_deep(8,8);
    sVar3 = utilMax(4,sVar2,a_00,d,sVar3);
    if (sVar3 < 0x801) {
      b_00 = local_2b8;
      seed = utilNonce32();
      prngCOMBOStart(b_00,seed);
      do {
        if (local_10 == 0) {
          return 1;
        }
        local_10 = local_10 + -1;
        prngCOMBOStepR(in_stack_fffffffffffff4b0,(size_t)in_stack_fffffffffffff4a8,
                       in_stack_fffffffffffff4a0);
        prngCOMBOStepR(in_stack_fffffffffffff4b0,(size_t)in_stack_fffffffffffff4a8,
                       in_stack_fffffffffffff4a0);
        sVar3 = local_58;
        if (local_58 == 0) {
          sVar3 = 1;
        }
        stack_00 = local_98;
        if (local_98 == (void *)0x0) {
          stack_00 = (void *)0x2;
        }
        local_98 = stack_00;
        local_58 = sVar3;
        for (local_ac0 = (word *)0x1; local_ac0 < (word *)0x8;
            local_ac0 = (word *)((long)local_ac0 + 1)) {
          for (local_ac8 = (word *)0x1; local_ac8 < (word *)0x8;
              local_ac8 = (word *)((long)local_ac8 + 1)) {
            zzGCD(d,a_00,sVar2,b_00,sVar3,stack_00);
            zzLCM(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                  (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                  (size_t)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
            zzMul(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                  (size_t)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                  (size_t)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
            in_stack_fffffffffffff4f8 = local_298;
            in_stack_fffffffffffff500 = local_d8;
            in_stack_fffffffffffff4f0 = local_ac8;
            if (local_ac0 < local_ac8) {
              in_stack_fffffffffffff4f0 = local_ac0;
            }
            zzMul(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                  (size_t)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                  (size_t)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
            in_stack_fffffffffffff4d0 = local_1d8;
            in_stack_fffffffffffff4d8 = (word *)((long)local_ac0 + (long)local_ac8);
            in_stack_fffffffffffff4e0 = local_298;
            in_stack_fffffffffffff4e8 = (word *)((long)local_ac0 + (long)local_ac8);
            in_stack_fffffffffffff4c8 = local_ac8;
            if (local_ac0 < local_ac8) {
              in_stack_fffffffffffff4c8 = local_ac0;
            }
            iVar1 = wwCmp2(in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
                           in_stack_fffffffffffff4b0,(size_t)in_stack_fffffffffffff4a8);
            if (iVar1 != 0) {
              return 0;
            }
            in_stack_fffffffffffff4a0 = local_ab8;
            zzExGCD(in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                    in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                    in_stack_fffffffffffff590,in_stack_fffffffffffff598);
            zzMul(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                  (size_t)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                  (size_t)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
            zzMul(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                  (size_t)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                  (size_t)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
            zzSub2(local_1d8,local_298,(long)local_ac0 + (long)local_ac8);
            in_stack_fffffffffffff4b0 = local_1d8;
            in_stack_fffffffffffff4b8 = (void *)((long)local_ac0 + (long)local_ac8);
            in_stack_fffffffffffff4c0 = local_d8;
            in_stack_fffffffffffff4a8 = local_ac8;
            if (local_ac0 < local_ac8) {
              in_stack_fffffffffffff4a8 = local_ac0;
            }
            iVar1 = wwCmp2(in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
                           in_stack_fffffffffffff4b0,(size_t)in_stack_fffffffffffff4a8);
            if (iVar1 != 0) {
              return 0;
            }
          }
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static bool_t zzTestGCD()
{
	enum { n = 8 };
	size_t reps = 100;
	word a[n];
	word b[n];
	word t[n];
	word t1[2 * n];
	word p[2 * n];
	word p1[3 * n];
	octet combo_state[32];
	octet stack[2048];
	// подготовить память
	if (sizeof(combo_state) < prngCOMBO_keep() ||
		sizeof(stack) < utilMax(4,
			zzMul_deep(n, n),
			zzGCD_deep(n, n),
			zzLCM_deep(n, n),
			zzExGCD_deep(n, n)))
		return FALSE;
	// инициализировать генератор COMBO
	prngCOMBOStart(combo_state, utilNonce32());
	// эксперименты
	while (reps--)
	{
		size_t na, nb;
		// генерация
		prngCOMBOStepR(a, O_OF_W(n), combo_state);
		prngCOMBOStepR(b, O_OF_W(n), combo_state);
		a[0] = a[0] ? a[0] : 1;
		b[0] = b[0] ? b[0] : 2;
		// цикл по длинами
		for (na = 1; na < n; ++na)
		for (nb = 1; nb < n; ++nb)
		{
			// zzGCD / zzLCM / zzMul
			zzGCD(t, a, na, b, nb, stack);
			zzLCM(t1, a, na, b, nb, stack);
			zzMul(p, a, na, b, nb, stack);
			zzMul(p1, t, MIN2(na, nb), t1, na + nb, stack);
			if (wwCmp2(p, na + nb, p1, na + nb + MIN2(na, nb)) != 0)
				return FALSE;
			// zzExGCD / zzMul
			zzExGCD(t, t1, t1 + n, a, na, b, nb, stack);
			zzMul(p, t1, nb, a, na, stack);
			zzMul(p1, t1 + n, na, b, nb, stack);
			zzSub2(p, p1, na + nb);
			if (wwCmp2(p, na + nb, t, MIN2(na, nb)) != 0)
				return FALSE;
		}
	}
	return TRUE;
}